

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O1

float ggml_bf16_to_fp32(ggml_bf16_t x)

{
  return (float)((uint)x.bits << 0x10);
}

Assistant:

static inline float ggml_compute_bf16_to_fp32(ggml_bf16_t h) {
    union {
        float f;
        uint32_t i;
    } u;
    u.i = (uint32_t)h.bits << 16;
    return u.f;
}